

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

AActor * P_SpawnPuff(AActor *source,PClassActor *pufftype,DVector3 *pos1,DAngle *hitdir,
                    DAngle *particledir,int updown,int flags,AActor *vict)

{
  byte *pbVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  SDWORD SVar5;
  AActor *this;
  FState *newstate;
  int iVar6;
  FSoundID *sound_id;
  FSoundID local_6c;
  FSoundID local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  DVector3 local_58;
  DAngle local_38;
  
  local_58.X = pos1->X;
  local_58.Y = pos1->Y;
  dVar2 = pos1->Z;
  local_58.Z = dVar2;
  if ((flags & 0x10U) == 0) {
    uVar3 = FRandom::GenRand32(&pr_spawnpuff);
    uVar4 = FRandom::GenRand32(&pr_spawnpuff);
    local_58.Z = dVar2 + (double)(int)((uVar3 & 0xff) - (uVar4 & 0xff)) * 0.015625;
  }
  this = AActor::StaticSpawn(pufftype,&local_58,ALLOW_REPLACE,false);
  if (this == (AActor *)0x0) {
    return (AActor *)0x0;
  }
  if ((((this->flags4).Value & 0x10) != 0) && (0 < this->tics)) {
    uVar3 = FRandom::GenRand32(&pr_spawnpuff);
    iVar6 = this->tics - (uVar3 & 3);
    SVar5 = 1;
    if (1 < iVar6) {
      SVar5 = iVar6;
    }
    this->tics = SVar5;
  }
  if (vict != (AActor *)0x0) {
    uVar3 = (this->flags7).Value;
    if ((uVar3 >> 0xe & 1) != 0) {
      (this->target).field_0.p = vict;
    }
    if ((short)uVar3 < 0) {
      (this->master).field_0.p = vict;
    }
    if ((uVar3 >> 0x10 & 1) != 0) {
      (this->tracer).field_0.p = vict;
    }
  }
  if (((this->flags5).Value & 0x800000) != 0) {
    (this->target).field_0.p = source;
  }
  (this->Angles).Yaw.Degrees = hitdir->Degrees + 180.0;
  if ((flags & 1U) == 0) {
    local_5c.Index = 0x86;
    newstate = AActor::FindState(this,&local_5c);
    if (newstate == (FState *)0x0) goto LAB_005539ab;
  }
  else {
LAB_005539ab:
    if ((flags & 8U) != 0) {
      local_60.Index = 0x87;
      local_64.Index = 0xc9;
      newstate = AActor::FindState(this,&local_60,&local_64,true);
      if (newstate != (FState *)0x0) goto LAB_005539e9;
    }
    if (((flags & 2U) == 0) || (newstate = this->MeleeState, newstate == (FState *)0x0))
    goto LAB_005539f6;
  }
LAB_005539e9:
  AActor::SetState(this,newstate,false);
LAB_005539f6:
  if ((flags & 4U) == 0) {
    if (((updown != 3) && (cl_pufftype.Value != 0)) && (((this->flags4).Value & 0x8000000) != 0)) {
      local_38 = (DAngle)particledir->Degrees;
      P_DrawSplash2(0x20,&local_58,&local_38,updown,1);
      pbVar1 = (byte *)((long)&(this->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if (((flags & 1U) == 0) || (iVar6 = (this->SeeSound).super_FSoundID.ID, iVar6 == 0)) {
      iVar6 = (this->AttackSound).super_FSoundID.ID;
      if (iVar6 == 0) {
        return this;
      }
      sound_id = &local_6c;
    }
    else {
      sound_id = &local_68;
    }
    sound_id->ID = iVar6;
    S_Sound(this,4,sound_id,1.0,1.0);
  }
  return this;
}

Assistant:

AActor *P_SpawnPuff (AActor *source, PClassActor *pufftype, const DVector3 &pos1, DAngle hitdir, DAngle particledir, int updown, int flags, AActor *vict)
{
	AActor *puff;
	DVector3 pos = pos1;

	if (!(flags & PF_NORANDOMZ)) pos.Z += pr_spawnpuff.Random2() / 64.;
	puff = Spawn(pufftype, pos, ALLOW_REPLACE);
	if (puff == NULL) return NULL;

	if ((puff->flags4 & MF4_RANDOMIZE) && puff->tics > 0)
	{
		puff->tics -= pr_spawnpuff() & 3;
		if (puff->tics < 1)
			puff->tics = 1;
	}

	//Moved puff creation and target/master/tracer setting to here. 
	if (puff && vict)
	{
		if (puff->flags7 & MF7_HITTARGET)	puff->target = vict;
		if (puff->flags7 & MF7_HITMASTER)	puff->master = vict;
		if (puff->flags7 & MF7_HITTRACER)	puff->tracer = vict;
	}
	// [BB] If the puff came from a player, set the target of the puff to this player.
	if ( puff && (puff->flags5 & MF5_PUFFGETSOWNER))
		puff->target = source;
	
	// Angle is the opposite of the hit direction (i.e. the puff faces the source.)
	puff->Angles.Yaw = hitdir + 180;

	// If a puff has a crash state and an actor was not hit,
	// it will enter the crash state. This is used by the StrifeSpark
	// and BlasterPuff.
	FState *crashstate;
	if (!(flags & PF_HITTHING) && (crashstate = puff->FindState(NAME_Crash)) != NULL)
	{
		puff->SetState (crashstate);
	}
	else if ((flags & PF_HITTHINGBLEED) && (crashstate = puff->FindState(NAME_Death, NAME_Extreme, true)) != NULL)
	{
		puff->SetState (crashstate);
	}
	else if ((flags & PF_MELEERANGE) && puff->MeleeState != NULL)
	{
		// handle the hard coded state jump of Doom's bullet puff
		// in a more flexible manner.
		puff->SetState (puff->MeleeState);
	}

	if (!(flags & PF_TEMPORARY))
	{
		if (cl_pufftype && updown != 3 && (puff->flags4 & MF4_ALLOWPARTICLES))
		{
			P_DrawSplash2 (32, pos, particledir, updown, 1);
			puff->renderflags |= RF_INVISIBLE;
		}

		if ((flags & PF_HITTHING) && puff->SeeSound)
		{ // Hit thing sound
			S_Sound (puff, CHAN_BODY, puff->SeeSound, 1, ATTN_NORM);
		}
		else if (puff->AttackSound)
		{
			S_Sound (puff, CHAN_BODY, puff->AttackSound, 1, ATTN_NORM);
		}
	}

	return puff;
}